

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int generateOutputSubroutine
              (Parse *pParse,Select *p,SelectDest *pIn,SelectDest *pDest,int regReturn,int regPrev,
              KeyInfo *pKeyInfo,int iBreak)

{
  int iVar1;
  Vdbe *p_00;
  char *zP4;
  byte bVar2;
  int p2;
  int iVar3;
  int iVar4;
  Op *pOVar5;
  Vdbe *p_01;
  int p3;
  int iVar6;
  
  p_00 = pParse->pVdbe;
  iVar1 = p_00->nOp;
  p2 = pParse->nLabel + -1;
  pParse->nLabel = p2;
  if (regPrev != 0) {
    iVar3 = sqlite3VdbeAddOp3(p_00,0x14,regPrev,0,0);
    iVar4 = pIn->iSdst;
    iVar6 = pIn->nSdst;
    if (pKeyInfo != (KeyInfo *)0x0) {
      pKeyInfo->nRef = pKeyInfo->nRef + 1;
    }
    iVar4 = sqlite3VdbeAddOp3(p_00,0x57,iVar4,regPrev + 1,iVar6);
    sqlite3VdbeChangeP4(p_00,iVar4,(char *)pKeyInfo,-9);
    sqlite3VdbeAddOp3(p_00,0x10,iVar4 + 2,p2,iVar4 + 2);
    if (p_00->db->mallocFailed == '\0') {
      iVar4 = p_00->nOp + -1;
      if (-1 < iVar3) {
        iVar4 = iVar3;
      }
      pOVar5 = p_00->aOp + iVar4;
    }
    else {
      pOVar5 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar5->p2 = p_00->nOp;
    sqlite3VdbeAddOp3(p_00,0x4e,pIn->iSdst,regPrev + 1,pIn->nSdst + -1);
    sqlite3VdbeAddOp3(p_00,0x46,1,regPrev,0);
  }
  if (pParse->db->mallocFailed != '\0') {
    return 0;
  }
  if (0 < p->iOffset) {
    sqlite3VdbeAddOp3(p_00,0x2f,p->iOffset,p2,1);
  }
  switch(pDest->eDest) {
  case '\n':
    iVar4 = pIn->iSdst;
    iVar6 = pDest->iSDParm;
    p_01 = pParse->pVdbe;
    iVar3 = 0x4d;
    p3 = 1;
    goto LAB_0017e886;
  case '\v':
    if (pParse->nTempReg == '\0') {
      iVar4 = pParse->nMem + 1;
      pParse->nMem = iVar4;
    }
    else {
      bVar2 = pParse->nTempReg - 1;
      pParse->nTempReg = bVar2;
      iVar4 = pParse->aTempReg[bVar2];
    }
    iVar6 = pIn->nSdst;
    zP4 = pDest->zAffSdst;
    iVar3 = sqlite3VdbeAddOp3(p_00,0x5c,pIn->iSdst,iVar6,iVar4);
    sqlite3VdbeChangeP4(p_00,iVar3,zP4,iVar6);
    iVar6 = pIn->nSdst;
    iVar3 = sqlite3VdbeAddOp3(p_00,0x84,pDest->iSDParm,iVar4,pIn->iSdst);
    if (p_00->db->mallocFailed == '\0') {
      pOVar5 = p_00->aOp;
      pOVar5[iVar3].p4type = -3;
      pOVar5[iVar3].p4.i = iVar6;
    }
    if (iVar4 != 0) {
      bVar2 = pParse->nTempReg;
      if ((ulong)bVar2 < 8) {
        pParse->nTempReg = bVar2 + 1;
        pParse->aTempReg[bVar2] = iVar4;
      }
    }
    goto LAB_0017e88b;
  case '\f':
    if (pParse->nTempReg == '\0') {
      iVar4 = pParse->nMem + 1;
      pParse->nMem = iVar4;
    }
    else {
      bVar2 = pParse->nTempReg - 1;
      pParse->nTempReg = bVar2;
      iVar4 = pParse->aTempReg[bVar2];
    }
    if (pParse->nTempReg == '\0') {
      iVar6 = pParse->nMem + 1;
      pParse->nMem = iVar6;
    }
    else {
      bVar2 = pParse->nTempReg - 1;
      pParse->nTempReg = bVar2;
      iVar6 = pParse->aTempReg[bVar2];
    }
    sqlite3VdbeAddOp3(p_00,0x5c,pIn->iSdst,pIn->nSdst,iVar4);
    sqlite3VdbeAddOp3(p_00,0x79,pDest->iSDParm,iVar6,0);
    sqlite3VdbeAddOp3(p_00,0x7a,pDest->iSDParm,iVar4,iVar6);
    if (0 < (long)p_00->nOp) {
      p_00->aOp[(long)p_00->nOp + -1].p5 = 8;
    }
    if (iVar6 != 0) {
      bVar2 = pParse->nTempReg;
      if ((ulong)bVar2 < 8) {
        pParse->nTempReg = bVar2 + 1;
        pParse->aTempReg[bVar2] = iVar6;
      }
    }
    if (iVar4 != 0) {
      bVar2 = pParse->nTempReg;
      if ((ulong)bVar2 < 8) {
        pParse->nTempReg = bVar2 + 1;
        pParse->aTempReg[bVar2] = iVar4;
      }
    }
    goto LAB_0017e88b;
  case '\r':
    if (pDest->iSdst == 0) {
      iVar4 = sqlite3GetTempRange(pParse,pIn->nSdst);
      pDest->iSdst = iVar4;
      pDest->nSdst = pIn->nSdst;
    }
    sqlite3VdbeAddOp3(pParse->pVdbe,0x4d,pIn->iSdst,pDest->iSdst,pIn->nSdst);
    iVar4 = pDest->iSDParm;
    iVar3 = 0xe;
    iVar6 = 0;
    break;
  default:
    iVar4 = pIn->iSdst;
    iVar6 = pIn->nSdst;
    iVar3 = 0x51;
  }
  p3 = 0;
  p_01 = p_00;
LAB_0017e886:
  sqlite3VdbeAddOp3(p_01,iVar3,iVar4,iVar6,p3);
LAB_0017e88b:
  if (p->iLimit != 0) {
    sqlite3VdbeAddOp3(p_00,0x31,p->iLimit,iBreak,0);
  }
  sqlite3VdbeResolveLabel(p_00,p2);
  sqlite3VdbeAddOp3(p_00,0x42,regReturn,0,0);
  return iVar1;
}

Assistant:

static int generateOutputSubroutine(
  Parse *pParse,          /* Parsing context */
  Select *p,              /* The SELECT statement */
  SelectDest *pIn,        /* Coroutine supplying data */
  SelectDest *pDest,      /* Where to send the data */
  int regReturn,          /* The return address register */
  int regPrev,            /* Previous result register.  No uniqueness if 0 */
  KeyInfo *pKeyInfo,      /* For comparing with previous entry */
  int iBreak              /* Jump here if we hit the LIMIT */
){
  Vdbe *v = pParse->pVdbe;
  int iContinue;
  int addr;

  addr = sqlite3VdbeCurrentAddr(v);
  iContinue = sqlite3VdbeMakeLabel(pParse);

  /* Suppress duplicates for UNION, EXCEPT, and INTERSECT 
  */
  if( regPrev ){
    int addr1, addr2;
    addr1 = sqlite3VdbeAddOp1(v, OP_IfNot, regPrev); VdbeCoverage(v);
    addr2 = sqlite3VdbeAddOp4(v, OP_Compare, pIn->iSdst, regPrev+1, pIn->nSdst,
                              (char*)sqlite3KeyInfoRef(pKeyInfo), P4_KEYINFO);
    sqlite3VdbeAddOp3(v, OP_Jump, addr2+2, iContinue, addr2+2); VdbeCoverage(v);
    sqlite3VdbeJumpHere(v, addr1);
    sqlite3VdbeAddOp3(v, OP_Copy, pIn->iSdst, regPrev+1, pIn->nSdst-1);
    sqlite3VdbeAddOp2(v, OP_Integer, 1, regPrev);
  }
  if( pParse->db->mallocFailed ) return 0;

  /* Suppress the first OFFSET entries if there is an OFFSET clause
  */
  codeOffset(v, p->iOffset, iContinue);

  assert( pDest->eDest!=SRT_Exists );
  assert( pDest->eDest!=SRT_Table );
  switch( pDest->eDest ){
    /* Store the result as data using a unique key.
    */
    case SRT_EphemTab: {
      int r1 = sqlite3GetTempReg(pParse);
      int r2 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp3(v, OP_MakeRecord, pIn->iSdst, pIn->nSdst, r1);
      sqlite3VdbeAddOp2(v, OP_NewRowid, pDest->iSDParm, r2);
      sqlite3VdbeAddOp3(v, OP_Insert, pDest->iSDParm, r1, r2);
      sqlite3VdbeChangeP5(v, OPFLAG_APPEND);
      sqlite3ReleaseTempReg(pParse, r2);
      sqlite3ReleaseTempReg(pParse, r1);
      break;
    }

#ifndef SQLITE_OMIT_SUBQUERY
    /* If we are creating a set for an "expr IN (SELECT ...)".
    */
    case SRT_Set: {
      int r1;
      testcase( pIn->nSdst>1 );
      r1 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp4(v, OP_MakeRecord, pIn->iSdst, pIn->nSdst, 
          r1, pDest->zAffSdst, pIn->nSdst);
      sqlite3VdbeAddOp4Int(v, OP_IdxInsert, pDest->iSDParm, r1,
                           pIn->iSdst, pIn->nSdst);
      sqlite3ReleaseTempReg(pParse, r1);
      break;
    }

    /* If this is a scalar select that is part of an expression, then
    ** store the results in the appropriate memory cell and break out
    ** of the scan loop.
    */
    case SRT_Mem: {
      assert( pIn->nSdst==1 || pParse->nErr>0 );  testcase( pIn->nSdst!=1 );
      sqlite3ExprCodeMove(pParse, pIn->iSdst, pDest->iSDParm, 1);
      /* The LIMIT clause will jump out of the loop for us */
      break;
    }
#endif /* #ifndef SQLITE_OMIT_SUBQUERY */

    /* The results are stored in a sequence of registers
    ** starting at pDest->iSdst.  Then the co-routine yields.
    */
    case SRT_Coroutine: {
      if( pDest->iSdst==0 ){
        pDest->iSdst = sqlite3GetTempRange(pParse, pIn->nSdst);
        pDest->nSdst = pIn->nSdst;
      }
      sqlite3ExprCodeMove(pParse, pIn->iSdst, pDest->iSdst, pIn->nSdst);
      sqlite3VdbeAddOp1(v, OP_Yield, pDest->iSDParm);
      break;
    }

    /* If none of the above, then the result destination must be
    ** SRT_Output.  This routine is never called with any other
    ** destination other than the ones handled above or SRT_Output.
    **
    ** For SRT_Output, results are stored in a sequence of registers.  
    ** Then the OP_ResultRow opcode is used to cause sqlite3_step() to
    ** return the next row of result.
    */
    default: {
      assert( pDest->eDest==SRT_Output );
      sqlite3VdbeAddOp2(v, OP_ResultRow, pIn->iSdst, pIn->nSdst);
      break;
    }
  }

  /* Jump to the end of the loop if the LIMIT is reached.
  */
  if( p->iLimit ){
    sqlite3VdbeAddOp2(v, OP_DecrJumpZero, p->iLimit, iBreak); VdbeCoverage(v);
  }

  /* Generate the subroutine return
  */
  sqlite3VdbeResolveLabel(v, iContinue);
  sqlite3VdbeAddOp1(v, OP_Return, regReturn);

  return addr;
}